

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

void canvas_duplicate(_glist *x)

{
  int iVar1;
  void *data;
  _binbuf *local_58;
  _binbuf *b;
  t_selection *y;
  int whoin;
  int whoout;
  t_object *inobj;
  t_object *outobj;
  t_gobj *ingobj;
  t_gobj *outgobj;
  int inno;
  int outno;
  int inindex;
  int outindex;
  _glist *x_local;
  
  if (x->gl_editor != (t_editor *)0x0) {
    if ((x->gl_editor->e_selection != (t_selection *)0x0) &&
       (((byte)x->gl_editor->field_0x88 >> 5 & 1) != 0)) {
      glist_deselectline(x);
    }
    if (((byte)x->gl_editor->field_0x88 >> 5 & 1) == 0) {
      if (((x->gl_editor->field_0x88 & 7) == 0) && (x->gl_editor->e_selection != (t_selection *)0x0)
         ) {
        local_58 = (_binbuf *)0x0;
        if (*(long *)(pd_maininstance.pd_gui)->i_editor != 0) {
          local_58 = binbuf_duplicate(*(_binbuf **)(pd_maininstance.pd_gui)->i_editor);
        }
        canvas_copy(x);
        data = canvas_undo_set_paste(x,0,1,10);
        canvas_undo_add(x,UNDO_PASTE,"duplicate",data);
        canvas_dopaste(x,*(_binbuf **)(pd_maininstance.pd_gui)->i_editor);
        for (b = (_binbuf *)x->gl_editor->e_selection; b != (_binbuf *)0x0; b = (_binbuf *)b->b_vec)
        {
          gobj_displace(*(t_gobj **)b,x,10,10);
        }
        if (local_58 != (_binbuf *)0x0) {
          if (*(long *)(pd_maininstance.pd_gui)->i_editor != 0) {
            binbuf_free(*(_binbuf **)(pd_maininstance.pd_gui)->i_editor);
          }
          *(_binbuf **)(pd_maininstance.pd_gui)->i_editor = local_58;
        }
        canvas_dirty(x,1.0);
      }
    }
    else {
      y._0_4_ = x->gl_editor->e_selectline_index2;
      outgobj._4_4_ = x->gl_editor->e_selectline_outno;
      outgobj._0_4_ = x->gl_editor->e_selectline_inno;
      ingobj = x->gl_list;
      for (y._4_4_ = x->gl_editor->e_selectline_index1; y._4_4_ != 0; y._4_4_ = y._4_4_ + -1) {
        if (ingobj->g_next == (_gobj *)0x0) {
          return;
        }
        ingobj = ingobj->g_next;
      }
      outobj = (t_object *)x->gl_list;
      for (; (int)y != 0; y._0_4_ = (int)y + -1) {
        if ((outobj->te_g).g_next == (_gobj *)0x0) {
          return;
        }
        outobj = (t_object *)(outobj->te_g).g_next;
      }
      while( true ) {
        outgobj._4_4_ = outgobj._4_4_ + 1;
        outgobj._0_4_ = (int)outgobj + 1;
        iVar1 = canconnect(x,(t_object *)ingobj,outgobj._4_4_,outobj,(int)outgobj);
        if (iVar1 != 0) break;
        if (ingobj == (t_gobj *)0x0) {
          return;
        }
        iVar1 = obj_noutlets((t_object *)ingobj);
        if (iVar1 <= outgobj._4_4_) {
          return;
        }
        if (outobj == (t_object *)0x0) {
          return;
        }
        iVar1 = obj_ninlets(outobj);
        if (iVar1 <= (int)outgobj) {
          return;
        }
      }
      iVar1 = tryconnect(x,(t_object *)ingobj,outgobj._4_4_,outobj,(int)outgobj);
      if (iVar1 != 0) {
        x->gl_editor->e_selectline_outno = outgobj._4_4_;
        x->gl_editor->e_selectline_inno = (int)outgobj;
      }
    }
  }
  return;
}

Assistant:

static void canvas_duplicate(t_canvas *x)
{
    if (!x->gl_editor)
        return;

    if (x->gl_editor->e_selection && x->gl_editor->e_selectedline)
        glist_deselectline(x);

        /* if a connection is selected, we extend it to the right (if possible) */
    if (x->gl_editor->e_selectedline)
    {
        int outindex = x->gl_editor->e_selectline_index1;
        int inindex  = x->gl_editor->e_selectline_index2;
        int outno = x->gl_editor->e_selectline_outno + 1;
        int inno  = x->gl_editor->e_selectline_inno + 1;
        t_gobj *outgobj = 0, *ingobj = 0;
        t_object *outobj = 0, *inobj = 0;
        int whoout = outindex;
        int whoin = inindex;

        for (outgobj = x->gl_list; whoout; outgobj = outgobj->g_next, whoout--)
            if (!outgobj->g_next) return;
        for (ingobj = x->gl_list; whoin; ingobj = ingobj->g_next, whoin--)
            if (!ingobj->g_next) return;
        outobj = (t_object*)outgobj;
        inobj = (t_object*)ingobj;

        while(!canconnect(x, outobj, outno, inobj, inno))
        {
            if (!outobj || obj_noutlets(outobj) <= outno)
                return;
            if (!inobj  || obj_ninlets (inobj ) <= inno )
                return;
            outno++;
            inno++;
        }

        if(tryconnect(x, outobj, outno, inobj, inno))
        {
            x->gl_editor->e_selectline_outno = outno;
            x->gl_editor->e_selectline_inno = inno;
        }
        return;
    }
    if (x->gl_editor->e_onmotion == MA_NONE && x->gl_editor->e_selection)
    {
        t_selection *y;
        t_binbuf*b = 0;
        if(EDITOR->copy_binbuf)
            b = binbuf_duplicate(EDITOR->copy_binbuf);
        canvas_copy(x);
        canvas_undo_add(x, UNDO_PASTE, "duplicate",
            (void *)canvas_undo_set_paste(x, 0, 1, PASTE_OFFSET));
        canvas_dopaste(x, EDITOR->copy_binbuf);
        for (y = x->gl_editor->e_selection; y; y = y->sel_next)
            gobj_displace(y->sel_what, x,
                PASTE_OFFSET, PASTE_OFFSET);
        if(b)
        {
            if(EDITOR->copy_binbuf)
                binbuf_free(EDITOR->copy_binbuf);
            EDITOR->copy_binbuf = b;
        }
        canvas_dirty(x, 1);
    }
}